

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_copy_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_copy_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  ngx_connection_t *pnVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ngx_int_t nVar4;
  bool local_49;
  ngx_http_copy_filter_conf_t *conf;
  ngx_http_core_loc_conf_t *clcf;
  ngx_output_chain_ctx_t *ctx;
  ngx_connection_t *c;
  ngx_int_t rc;
  ngx_chain_t *in_local;
  ngx_http_request_t *r_local;
  
  pnVar1 = r->connection;
  if ((pnVar1->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar1->log,0,"http copy filter: \"%V?%V\"",&r->uri,&r->args);
  }
  clcf = (ngx_http_core_loc_conf_t *)r->ctx[ngx_http_copy_filter_module.ctx_index];
  if (clcf == (ngx_http_core_loc_conf_t *)0x0) {
    clcf = (ngx_http_core_loc_conf_t *)ngx_pcalloc(r->pool,0x68);
    if (clcf == (ngx_http_core_loc_conf_t *)0x0) {
      return -1;
    }
    r->ctx[ngx_http_copy_filter_module.ctx_index] = clcf;
    puVar2 = (undefined8 *)r->loc_conf[ngx_http_copy_filter_module.ctx_index];
    pvVar3 = r->loc_conf[ngx_http_core_module.ctx_index];
    *(byte *)&clcf->static_locations =
         *(byte *)&clcf->static_locations & 0xfe | (byte)(*(uint *)&pnVar1->field_0xd8 >> 0x12) & 1;
    local_49 = true;
    if ((*(ulong *)&r->field_0x468 >> 0x1d & 1) == 0) {
      local_49 = (*(ulong *)&r->field_0x468 >> 0x1e & 1) != 0;
    }
    *(byte *)&clcf->static_locations = *(byte *)&clcf->static_locations & 0xf7 | local_49 << 3;
    *(byte *)&clcf->static_locations =
         *(byte *)&clcf->static_locations & 0xef |
         ((byte)(*(ulong *)&r->field_0x468 >> 0x1f) & 1) << 4;
    clcf->regex_locations = *(ngx_http_core_loc_conf_t ***)((long)pvVar3 + 0xc0);
    clcf->loc_conf = (void **)r->pool;
    clcf->limit_except_loc_conf = (void **)*puVar2;
    clcf->handler = (ngx_http_handler_pt)puVar2[1];
    clcf->alias = (size_t)&ngx_http_copy_filter_module;
    (clcf->root).len = (size_t)ngx_http_next_body_filter;
    (clcf->root).data = (u_char *)r;
    if ((in != (ngx_chain_t *)0x0) && (in->buf != (ngx_buf_t *)0x0)) {
      if (((*(ushort *)&in->buf->field_0x48 & 1) == 0) &&
         (((*(ushort *)&in->buf->field_0x48 >> 1 & 1) == 0 &&
          ((*(ushort *)&in->buf->field_0x48 >> 2 & 1) == 0)))) {
        if (in->buf->file_last == in->buf->file_pos) goto LAB_001a6eeb;
      }
      else if (in->buf->last == in->buf->pos) goto LAB_001a6eeb;
      *(ulong *)&r->field_0x468 = *(ulong *)&r->field_0x468 & 0xfffffffffff7ffff | 0x80000;
    }
  }
LAB_001a6eeb:
  nVar4 = ngx_output_chain((ngx_output_chain_ctx_t *)clcf,in);
  if ((clcf->name).data == (u_char *)0x0) {
    *(ulong *)&r->field_0x468 =
         *(ulong *)&r->field_0x468 & 0xffffffffe1ffffff |
         (ulong)((uint)(*(ulong *)&r->field_0x468 >> 0x19) & 0xb) << 0x19;
  }
  else {
    *(ulong *)&r->field_0x468 =
         *(ulong *)&r->field_0x468 & 0xffffffffe1ffffff |
         (ulong)((uint)(*(ulong *)&r->field_0x468 >> 0x19) & 0xf | 4) << 0x19;
  }
  if ((pnVar1->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar1->log,0,"http copy filter: %i \"%V?%V\"",nVar4,&r->uri,&r->args);
  }
  return nVar4;
}

Assistant:

static ngx_int_t
ngx_http_copy_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                     rc;
    ngx_connection_t             *c;
    ngx_output_chain_ctx_t       *ctx;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_copy_filter_conf_t  *conf;

    c = r->connection;

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http copy filter: \"%V?%V\"", &r->uri, &r->args);

    ctx = ngx_http_get_module_ctx(r, ngx_http_copy_filter_module);

    if (ctx == NULL) {
        ctx = ngx_pcalloc(r->pool, sizeof(ngx_output_chain_ctx_t));
        if (ctx == NULL) {
            return NGX_ERROR;
        }

        ngx_http_set_ctx(r, ctx, ngx_http_copy_filter_module);

        conf = ngx_http_get_module_loc_conf(r, ngx_http_copy_filter_module);
        clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

        ctx->sendfile = c->sendfile;
        ctx->need_in_memory = r->main_filter_need_in_memory
                              || r->filter_need_in_memory;
        ctx->need_in_temp = r->filter_need_temporary;

        ctx->alignment = clcf->directio_alignment;

        ctx->pool = r->pool;
        ctx->bufs = conf->bufs;
        ctx->tag = (ngx_buf_tag_t) &ngx_http_copy_filter_module;

        ctx->output_filter = (ngx_output_chain_filter_pt)
                                  ngx_http_next_body_filter;
        ctx->filter_ctx = r;

#if (NGX_HAVE_FILE_AIO)
        if (ngx_file_aio && clcf->aio == NGX_HTTP_AIO_ON) {
            ctx->aio_handler = ngx_http_copy_aio_handler;
#if (NGX_HAVE_AIO_SENDFILE)
            ctx->aio_preload = ngx_http_copy_aio_sendfile_preload;
#endif
        }
#endif

#if (NGX_THREADS)
        if (clcf->aio == NGX_HTTP_AIO_THREADS) {
            ctx->thread_handler = ngx_http_copy_thread_handler;
        }
#endif

        if (in && in->buf && ngx_buf_size(in->buf)) {
            r->request_output = 1;
        }
    }

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
    ctx->aio = r->aio;
#endif

    rc = ngx_output_chain(ctx, in);

    if (ctx->in == NULL) {
        r->buffered &= ~NGX_HTTP_COPY_BUFFERED;

    } else {
        r->buffered |= NGX_HTTP_COPY_BUFFERED;
    }

    ngx_log_debug3(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http copy filter: %i \"%V?%V\"", rc, &r->uri, &r->args);

    return rc;
}